

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::Pattern::Pattern(Pattern *this,string *name)

{
  string *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Pattern_00303240;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

TestSpec::Pattern::Pattern( std::string const& name )
    : m_name( name )
    {}